

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleVector.h
# Opt level: O0

void __thiscall
SimpleVector<MiniScript::InputBufferEntry>::push_back
          (SimpleVector<MiniScript::InputBufferEntry> *this,InputBufferEntry *item)

{
  ulong local_30;
  ulong local_20;
  unsigned_long expandBy;
  InputBufferEntry *item_local;
  SimpleVector<MiniScript::InputBufferEntry> *this_local;
  
  while (this->mBufItems <= this->mQtyItems) {
    if (this->mBlockItems == 0) {
      local_30 = this->mBufItems;
    }
    else {
      local_30 = this->mBlockItems;
    }
    local_20 = local_30;
    if (local_30 < 0x10) {
      local_20 = 0x10;
    }
    resizeBuffer(this,this->mBufItems + local_20);
  }
  this->mBuf[this->mQtyItems] = *item;
  this->mQtyItems = this->mQtyItems + 1;
  return;
}

Assistant:

inline void SimpleVector<T>::push_back(const T& item)
{
	// do we need to increase the buffer size?
	while (mQtyItems >= mBufItems) {
		// yes -- expand it by one block (should never need more than that!),
		// or by double the size
		unsigned long expandBy = (mBlockItems > 0 ? mBlockItems : mBufItems);
		if (expandBy < 16) expandBy = 16;
		resizeBuffer( mBufItems + expandBy );
	}
	// stuff the item
	mBuf[mQtyItems] = item;
	mQtyItems++;
}